

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O3

QModelIndex * __thiscall
QSqlTableModel::indexInQuery
          (QModelIndex *__return_storage_ptr__,QSqlTableModel *this,QModelIndex *item)

{
  int maxRow;
  QSqlTableModelPrivate *this_00;
  const_iterator cVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSqlTableModelPrivate **)&(this->super_QSqlQueryModel).field_0x8;
  local_48.r = item->r;
  cVar1 = QMap<int,_QSqlTableModelPrivate::ModifiedRow>::find(&this_00->cache,&local_48.r);
  cVar2._M_node = (_Base_ptr)(this_00->cache).d.d.ptr;
  if ((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
       *)cVar2._M_node !=
      (QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
       *)0x0) {
    cVar2._M_node =
         &(((QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
             *)cVar2._M_node)->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  if ((cVar1.i._M_node == (const_iterator)cVar2._M_node) ||
     (*(char *)((long)cVar1.i._M_node + 0x41) != '\x01')) {
    maxRow = item->r;
    local_48.r = QSqlTableModelPrivate::insertCount(this_00,maxRow);
    local_48.r = maxRow - local_48.r;
    local_48.c = item->c;
    local_48.i = item->i;
    local_48.m.ptr = (QAbstractItemModel *)this;
    QSqlQueryModel::indexInQuery(__return_storage_ptr__,&this->super_QSqlQueryModel,&local_48);
  }
  else {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QSqlTableModel::indexInQuery(const QModelIndex &item) const
{
    Q_D(const QSqlTableModel);
    const auto it = d->cache.constFind(item.row());
    if (it != d->cache.constEnd() && it->insert())
        return QModelIndex();

    const int rowOffset = d->insertCount(item.row());
    return QSqlQueryModel::indexInQuery(createIndex(item.row() - rowOffset, item.column(), item.internalPointer()));
}